

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

size_t __thiscall
CoreML::Specification::UniDirectionalLSTMLayerParams::ByteSizeLong
          (UniDirectionalLSTMLayerParams *this)

{
  long lVar1;
  Rep *pRVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  size_t sVar8;
  void **ppvVar9;
  
  sVar8 = (size_t)(this->activations_).super_RepeatedPtrFieldBase.current_size_;
  pRVar2 = (this->activations_).super_RepeatedPtrFieldBase.rep_;
  ppvVar9 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar9 = (void **)0x0;
  }
  if (sVar8 == 0) {
    sVar8 = 0;
  }
  else {
    lVar1 = sVar8 * 8;
    lVar7 = 0;
    do {
      sVar5 = ActivationParams::ByteSizeLong(*(ActivationParams **)((long)ppvVar9 + lVar7));
      uVar4 = (uint)sVar5 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar8 = sVar8 + sVar5 + (ulong)(iVar3 * 9 + 0x49U >> 6);
      lVar7 = lVar7 + 8;
    } while (lVar1 - lVar7 != 0);
  }
  if (this != (UniDirectionalLSTMLayerParams *)_UniDirectionalLSTMLayerParams_default_instance_ &&
      this->params_ != (LSTMParams *)0x0) {
    sVar5 = LSTMParams::ByteSizeLong(this->params_);
    uVar4 = (uint)sVar5 | 1;
    iVar3 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    sVar8 = sVar8 + sVar5 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
  }
  if (this->weightparams_ != (LSTMWeightParams *)0x0 &&
      this != (UniDirectionalLSTMLayerParams *)_UniDirectionalLSTMLayerParams_default_instance_) {
    sVar5 = LSTMWeightParams::ByteSizeLong(this->weightparams_);
    uVar4 = (uint)sVar5 | 1;
    iVar3 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    sVar8 = sVar8 + sVar5 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 2;
  }
  if (this->inputvectorsize_ != 0) {
    uVar6 = this->inputvectorsize_ | 1;
    lVar1 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar8 = sVar8 + ((int)lVar1 * 9 + 0x89U >> 6);
  }
  if (this->outputvectorsize_ != 0) {
    uVar6 = this->outputvectorsize_ | 1;
    lVar1 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar8 = sVar8 + ((int)lVar1 * 9 + 0x89U >> 6);
  }
  sVar5 = sVar8 + 3;
  if (this->reverseinput_ == false) {
    sVar5 = sVar8;
  }
  uVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar6 & 1) != 0) {
    sVar5 = sVar5 + *(long *)((uVar6 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar5;
  return sVar5;
}

Assistant:

size_t UniDirectionalLSTMLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.UniDirectionalLSTMLayerParams)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .CoreML.Specification.ActivationParams activations = 10;
  total_size += 1UL * this->_internal_activations_size();
  for (const auto& msg : this->activations_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // .CoreML.Specification.LSTMParams params = 15;
  if (this->_internal_has_params()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *params_);
  }

  // .CoreML.Specification.LSTMWeightParams weightParams = 20;
  if (this->_internal_has_weightparams()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *weightparams_);
  }

  // uint64 inputVectorSize = 1;
  if (this->_internal_inputvectorsize() != 0) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::UInt64SizePlusOne(this->_internal_inputvectorsize());
  }

  // uint64 outputVectorSize = 2;
  if (this->_internal_outputvectorsize() != 0) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::UInt64SizePlusOne(this->_internal_outputvectorsize());
  }

  // bool reverseInput = 100;
  if (this->_internal_reverseinput() != 0) {
    total_size += 2 + 1;
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}